

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNeuron.cpp
# Opt level: O1

void __thiscall
BasicNeuron::Backward
          (BasicNeuron *this,float sumOutput,float delta,size_t totalNeurons,size_t activeNeurons,
          float meanReversedSquaredThresholds)

{
  long *plVar1;
  char cVar2;
  long *plVar3;
  ISynapse *outputSynapsePtr;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  
  if (*(long *)&this->field_0x98 == 0) {
    this->grad = delta;
  }
  for (puVar4 = *(undefined8 **)&this->field_0x90; puVar4 != (undefined8 *)0x0;
      puVar4 = (undefined8 *)*puVar4) {
    plVar1 = (long *)puVar4[1];
    cVar2 = ISynapse::IsUpdatable();
    if (cVar2 != '\0') {
      plVar3 = (long *)ISynapse::GetPostSynapticNeuron();
      fVar5 = (float)(**(code **)(*plVar3 + 0x48))(plVar3);
      fVar6 = (float)(**(code **)(*plVar1 + 8))(plVar1);
      this->grad = fVar6 * fVar5 + this->grad;
      (**(code **)(*plVar1 + 0x38))(*(undefined4 *)&this->field_0xbc,plVar1);
    }
  }
  return;
}

Assistant:

void BasicNeuron::Backward( float sumOutput, float delta, size_t totalNeurons, size_t activeNeurons,
                            float meanReversedSquaredThresholds )
{
    if ( outputSynapses.empty()) {
        grad = delta;
    }
    for ( ISynapse *outputSynapse: outputSynapses ) {
        auto outputSynapsePtr = outputSynapse;
        if ( !( outputSynapsePtr->IsUpdatable())) {
            continue;
        }
        auto next = outputSynapsePtr->GetPostSynapticNeuron();
        grad += next->GetGrad() * outputSynapsePtr->GetStrength();
        outputSynapsePtr->Backward( potential );
    }
}